

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_write.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  FILE *__stream;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ssize_t nwritten;
  int err;
  int errlen;
  char *errmsg;
  stat fileinfo;
  char *ptr;
  size_t nread;
  char mem [1024];
  FILE *local;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  int rc;
  char *fingerprint;
  sockaddr_in sin;
  int auth_pw;
  int i;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  sin.sin_zero[0] = '\x01';
  sin.sin_zero[1] = '\0';
  sin.sin_zero[2] = '\0';
  sin.sin_zero[3] = '\0';
  channel = (LIBSSH2_CHANNEL *)0x0;
  if (argc < 2) {
    i = htonl(0x7f000001);
  }
  else {
    i = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    loclfile = argv[4];
  }
  if (5 < argc) {
    scppath = argv[5];
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __stream = fopen(loclfile,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open local file %s\n",loclfile);
    return 1;
  }
  stat(loclfile,(stat *)&errmsg);
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fprintf(_stderr,"failed to create socket!\n");
  }
  else {
    fingerprint._0_2_ = 2;
    fingerprint._2_2_ = htons(0x16);
    fingerprint._4_4_ = i;
    iVar4 = connect(__fd,(sockaddr *)&fingerprint,0x10);
    if (iVar4 == 0) {
      channel = (LIBSSH2_CHANNEL *)libssh2_session_init_ex(0,0,0);
      if (channel == (LIBSSH2_CHANNEL *)0x0) {
        fprintf(_stderr,"Could not initialize SSH session!\n");
      }
      else {
        uVar3 = libssh2_session_handshake(channel,__fd);
        if (uVar3 == 0) {
          lVar5 = libssh2_hostkey_hash(channel,2);
          fprintf(_stderr,"Fingerprint: ");
          sin.sin_zero[4] = '\0';
          sin.sin_zero[5] = '\0';
          sin.sin_zero[6] = '\0';
          sin.sin_zero[7] = '\0';
          for (; (int)sin.sin_zero._4_4_ < 0x14; sin.sin_zero._4_4_ = sin.sin_zero._4_4_ + 1) {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + (int)sin.sin_zero._4_4_));
          }
          fprintf(_stderr,"\n");
          pcVar1 = username;
          if (sin.sin_zero._0_4_ == 0) {
            sVar6 = strlen(username);
            iVar4 = libssh2_userauth_publickey_fromfile_ex
                              (channel,pcVar1,sVar6 & 0xffffffff,pubkey,privkey,password);
            if (iVar4 != 0) {
              fprintf(_stderr,"Authentication by public key failed!\n");
              goto LAB_00101894;
            }
          }
          else {
            sVar6 = strlen(username);
            pcVar2 = password;
            sVar7 = strlen(password);
            iVar4 = libssh2_userauth_password_ex
                              (channel,pcVar1,sVar6 & 0xffffffff,pcVar2,sVar7 & 0xffffffff,0);
            if (iVar4 != 0) {
              fprintf(_stderr,"Authentication by password failed!\n");
              goto LAB_00101894;
            }
          }
          lVar5 = libssh2_scp_send_ex(channel,scppath,(uint)fileinfo.st_nlink & 0x1ff,
                                      fileinfo.st_rdev,0);
          if (lVar5 == 0) {
            nwritten._0_4_ = libssh2_session_last_error(channel,&err,(long)&nwritten + 4,0);
            fprintf(_stderr,"Unable to open a session: (%d) %s\n",(ulong)(uint)nwritten,_err);
          }
          else {
            fprintf(_stderr,"SCP session waiting to send file\n");
LAB_0010174a:
            ptr = (char *)fread(&nread,1,0x400,__stream);
            if (ptr != (char *)0x0) {
              fileinfo.__glibc_reserved[2] = (__syscall_slong_t)&nread;
              do {
                uVar8 = libssh2_channel_write_ex(lVar5,0,fileinfo.__glibc_reserved[2],ptr);
                if ((long)uVar8 < 0) {
                  fprintf(_stderr,"ERROR %d\n",uVar8 & 0xffffffff);
                  break;
                }
                fileinfo.__glibc_reserved[2] = uVar8 + fileinfo.__glibc_reserved[2];
                ptr = ptr + -uVar8;
              } while (ptr != (char *)0x0);
              goto LAB_0010174a;
            }
            fprintf(_stderr,"Sending EOF\n");
            libssh2_channel_send_eof(lVar5);
            fprintf(_stderr,"Waiting for EOF\n");
            libssh2_channel_wait_eof(lVar5);
            fprintf(_stderr,"Waiting for channel to close\n");
            libssh2_channel_wait_closed(lVar5);
            libssh2_channel_free(lVar5);
          }
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
        }
      }
    }
    else {
      fprintf(_stderr,"failed to connect!\n");
    }
  }
LAB_00101894:
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    libssh2_session_disconnect_ex(channel,0xb,"Normal Shutdown","");
    libssh2_session_free(channel);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  fprintf(_stderr,"all done\n");
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    FILE *local;
    char mem[1024];
    size_t nread;
    char *ptr;
    struct stat fileinfo;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        scppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    stat(loclfile, &fileinfo);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        if(libssh2_userauth_password(session, username, password)) {
            fprintf(stderr, "Authentication by password failed!\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        if(libssh2_userauth_publickey_fromfile(session, username,
                                               pubkey, privkey,
                                               password)) {
            fprintf(stderr, "Authentication by public key failed!\n");
            goto shutdown;
        }
    }

    /* Send a file via scp. The mode parameter must only have permissions! */
    channel = libssh2_scp_send(session, scppath, fileinfo.st_mode & 0777,
                               (size_t)fileinfo.st_size);

    if(!channel) {
        char *errmsg;
        int errlen;
        int err;
        err = libssh2_session_last_error(session, &errmsg, &errlen, 0);
        fprintf(stderr, "Unable to open a session: (%d) %s\n", err, errmsg);
        goto shutdown;
    }

    fprintf(stderr, "SCP session waiting to send file\n");
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        do {
            ssize_t nwritten;
            /* write the same data over and over, until error or completion */
            nwritten = libssh2_channel_write(channel, ptr, nread);
            if(nwritten < 0) {
                fprintf(stderr, "ERROR %d\n", (int)nwritten);
                break;
            }
            else {
                /* nwritten indicates how many bytes were written this time */
                ptr += nwritten;
                nread -= nwritten;
            }
        } while(nread);

    } while(1);

    fprintf(stderr, "Sending EOF\n");
    libssh2_channel_send_eof(channel);

    fprintf(stderr, "Waiting for EOF\n");
    libssh2_channel_wait_eof(channel);

    fprintf(stderr, "Waiting for channel to close\n");
    libssh2_channel_wait_closed(channel);

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    if(local)
        fclose(local);

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return 0;
}